

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O3

void work_lda_fxc_pol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  double __x;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double __x_00;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  undefined1 auVar195 [16];
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  undefined1 auVar207 [16];
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  undefined1 auVar220 [16];
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  undefined1 auVar230 [16];
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  undefined1 auVar243 [16];
  double dVar246;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  undefined1 auVar258 [16];
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double local_df0;
  double local_ce8;
  double local_b08;
  double local_758;
  double local_5f8;
  double dStack_5f0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double local_4a8;
  double dStack_4a0;
  double local_488;
  double dStack_480;
  double local_478;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_418;
  double dStack_410;
  double local_408;
  double local_3d8;
  double dStack_3d0;
  double local_3b8;
  
  if (np != 0) {
    sVar4 = 0;
    local_758 = 0.0;
    do {
      lVar3 = (long)(p->dim).rho * sVar4;
      dVar77 = rho[lVar3];
      if (p->nspin == 2) {
        dVar77 = dVar77 + rho[lVar3 + 1];
      }
      dVar146 = p->dens_threshold;
      if (dVar146 <= dVar77) {
        if ((p->nspin == 2) && (local_758 = rho[lVar3 + 1], rho[lVar3 + 1] <= dVar146)) {
          local_758 = dVar146;
        }
        dVar77 = rho[lVar3];
        if (rho[lVar3] <= dVar146) {
          dVar77 = dVar146;
        }
        dVar9 = cbrt(0.3183098861837907);
        dVar10 = dVar9 * 1.4422495703074083;
        dVar11 = dVar10 * 2.519842099789747;
        dVar112 = dVar77 - local_758;
        dVar77 = dVar77 + local_758;
        dVar78 = 1.0 / dVar77;
        __x_00 = dVar112 * dVar78 + 1.0;
        dVar146 = p->zeta_threshold;
        dVar12 = cbrt(dVar146);
        dVar13 = cbrt(__x_00);
        local_ce8 = dVar146 * dVar12;
        dVar14 = local_ce8;
        if (dVar146 < __x_00) {
          dVar14 = __x_00 * dVar13;
        }
        dVar15 = dVar14 * 1.5874010519681996;
        dVar16 = cbrt(dVar77);
        dVar17 = cbrt(9.0);
        dVar79 = dVar9 * dVar9;
        dVar18 = dVar17 * dVar17 * dVar79;
        dVar80 = p->cam_omega * dVar18;
        dVar113 = 1.0 / dVar16;
        dVar114 = dVar113 * 1.4422495703074083;
        uVar5 = -(ulong)(__x_00 <= dVar146);
        dVar160 = (double)(uVar5 & (ulong)dVar12 | ~uVar5 & (ulong)dVar13);
        dVar19 = 1.0 / dVar160;
        dVar138 = (dVar19 * dVar114 * dVar80) / 18.0;
        dVar17 = 1.92;
        if (dVar138 <= 1.92) {
          dVar17 = dVar138;
        }
        dVar20 = atan2(1.0,dVar17);
        dVar81 = dVar17 * dVar17;
        dVar21 = 1.0 / dVar81;
        dVar22 = dVar21 + 1.0;
        dVar23 = log(dVar22);
        dVar254 = dVar138;
        if (dVar138 <= 1.92) {
          dVar254 = 1.92;
        }
        dVar221 = dVar254 * dVar254;
        dVar272 = dVar221 * dVar221;
        dVar163 = dVar272 * dVar272;
        dVar259 = dVar272 * dVar221;
        dVar270 = dVar163 * dVar163;
        dVar24 = 1.0 / (dVar163 * dVar221);
        auVar220._0_8_ = dVar259 * dVar163;
        auVar220._8_8_ = dVar270;
        auVar243 = divpd(_DAT_0101f460,auVar220);
        dVar246 = auVar243._8_8_;
        auVar148._8_8_ = dVar246;
        auVar148._0_8_ = dVar246;
        auVar69._8_8_ = dVar246;
        auVar69._0_8_ = dVar246;
        auVar147._8_8_ = dVar272 * dVar163;
        auVar147._0_8_ = dVar163 * dVar221;
        auVar147 = divpd(auVar69,auVar147);
        dVar253 = 1.0 / (dVar272 * dVar163);
        auVar195._0_8_ = dVar163 * dVar259;
        auVar195._8_8_ = dVar270 * dVar270;
        auVar251._8_8_ = dVar163;
        auVar251._0_8_ = dVar259;
        auVar72._8_8_ = dVar246;
        auVar72._0_8_ = dVar246;
        auVar220 = divpd(auVar72,auVar251);
        auVar70._8_8_ = 0x3ff0000000000000;
        auVar70._0_8_ = dVar246;
        auVar195 = divpd(auVar70,auVar195);
        auVar207._8_8_ = dVar272;
        auVar207._0_8_ = dVar221;
        auVar251 = divpd(auVar148,auVar207);
        dVar196 = auVar195._8_8_;
        auVar71._8_8_ = dVar196;
        auVar71._0_8_ = dVar196;
        auVar68._8_8_ = dVar272;
        auVar68._0_8_ = dVar221;
        auVar207 = divpd(auVar71,auVar68);
        dVar270 = dVar81 + 3.0;
        dVar82 = 1.0 - dVar23 * dVar270;
        dVar20 = dVar17 * dVar82 * 0.25 + dVar20;
        dVar83 = 1.0 / dVar272;
        dVar177 = 1.0 / dVar259;
        dVar115 = 1.0 / dVar163;
        if (dVar138 < 1.92) {
          local_b08 = dVar20 * -2.6666666666666665 * dVar17 + 1.0;
        }
        else {
          auVar68 = divpd(auVar243,_DAT_0103afd0);
          auVar69 = divpd(auVar251,_DAT_0103afe0);
          auVar70 = divpd(auVar220,_DAT_0103aff0);
          auVar148 = divpd(auVar147,_DAT_0103b000);
          auVar71 = divpd(auVar195,_DAT_0103b010);
          auVar72 = divpd(auVar207,_DAT_0103b020);
          local_b08 = (((((((((((dVar253 / -364.0 +
                                 dVar24 / 231.0 +
                                 dVar115 / -135.0 +
                                 dVar177 / 70.0 + dVar83 / -30.0 + (1.0 / dVar221) / 9.0 +
                                auVar68._0_8_) - auVar68._8_8_) + auVar69._0_8_) - auVar69._8_8_) +
                            auVar70._0_8_) - auVar70._8_8_) + auVar148._0_8_) - auVar148._8_8_) +
                        auVar71._0_8_) - auVar71._8_8_) + auVar72._0_8_) - auVar72._8_8_;
        }
        __x = 1.0 - dVar112 * dVar78;
        dVar1 = p->zeta_threshold;
        dVar25 = cbrt(__x);
        if (dVar1 < __x) {
          local_ce8 = __x * dVar25;
        }
        dVar116 = local_ce8 * 1.5874010519681996;
        uVar6 = -(ulong)(__x <= dVar1);
        dVar67 = (double)((ulong)dVar12 & uVar6 | ~uVar6 & (ulong)dVar25);
        dVar26 = 1.0 / dVar67;
        dVar117 = (dVar114 * dVar26 * dVar80) / 18.0;
        dVar12 = 1.92;
        if (dVar117 <= 1.92) {
          dVar12 = dVar117;
        }
        dVar27 = atan2(1.0,dVar12);
        dVar84 = dVar12 * dVar12;
        dVar28 = 1.0 / dVar84;
        dVar29 = dVar28 + 1.0;
        dVar30 = log(dVar29);
        dVar129 = dVar117;
        if (dVar117 <= 1.92) {
          dVar129 = 1.92;
        }
        dVar197 = dVar129 * dVar129;
        dVar273 = dVar197 * dVar197;
        dVar186 = dVar273 * dVar273;
        dVar260 = dVar273 * dVar197;
        dVar271 = dVar186 * dVar186;
        dVar31 = 1.0 / (dVar186 * dVar197);
        auVar176._0_8_ = dVar260 * dVar186;
        auVar176._8_8_ = dVar271;
        auVar68 = divpd(_DAT_0101f460,auVar176);
        dVar162 = auVar68._8_8_;
        auVar258._8_8_ = dVar162;
        auVar258._0_8_ = dVar162;
        auVar175._8_8_ = dVar162;
        auVar175._0_8_ = dVar162;
        auVar73._8_8_ = dVar273 * dVar186;
        auVar73._0_8_ = dVar186 * dVar197;
        auVar69 = divpd(auVar175,auVar73);
        dVar178 = 1.0 / (dVar273 * dVar186);
        auVar76._0_8_ = dVar186 * dVar260;
        auVar76._8_8_ = dVar271 * dVar271;
        auVar245._8_8_ = dVar186;
        auVar245._0_8_ = dVar260;
        auVar252._8_8_ = dVar162;
        auVar252._0_8_ = dVar162;
        auVar72 = divpd(auVar252,auVar245);
        auVar230._8_8_ = 0x3ff0000000000000;
        auVar230._0_8_ = dVar162;
        auVar70 = divpd(auVar230,auVar76);
        auVar74._8_8_ = dVar273;
        auVar74._0_8_ = dVar197;
        auVar148 = divpd(auVar258,auVar74);
        dVar231 = auVar70._8_8_;
        auVar244._8_8_ = dVar231;
        auVar244._0_8_ = dVar231;
        auVar75._8_8_ = dVar273;
        auVar75._0_8_ = dVar197;
        auVar71 = divpd(auVar244,auVar75);
        dVar271 = dVar84 + 3.0;
        dVar85 = 1.0 - dVar30 * dVar271;
        dVar27 = dVar12 * dVar85 * 0.25 + dVar27;
        dVar86 = 1.0 / dVar273;
        dVar208 = 1.0 / dVar260;
        dVar118 = 1.0 / dVar186;
        if (dVar117 < 1.92) {
          dVar179 = dVar27 * -2.6666666666666665 * dVar12 + 1.0;
        }
        else {
          auVar73 = divpd(auVar68,_DAT_0103afd0);
          auVar74 = divpd(auVar148,_DAT_0103afe0);
          auVar75 = divpd(auVar72,_DAT_0103aff0);
          auVar176 = divpd(auVar69,_DAT_0103b000);
          auVar76 = divpd(auVar70,_DAT_0103b010);
          auVar245 = divpd(auVar71,_DAT_0103b020);
          dVar179 = (((((((((((dVar178 / -364.0 +
                               dVar31 / 231.0 +
                               dVar118 / -135.0 +
                               dVar208 / 70.0 + dVar86 / -30.0 + (1.0 / dVar197) / 9.0 +
                              auVar73._0_8_) - auVar73._8_8_) + auVar74._0_8_) - auVar74._8_8_) +
                          auVar75._0_8_) - auVar75._8_8_) + auVar176._0_8_) - auVar176._8_8_) +
                      auVar76._0_8_) - auVar76._8_8_) + auVar245._0_8_) - auVar245._8_8_;
        }
        dVar119 = dVar16 * dVar179;
        dVar149 = dVar113 * 2.519842099789747 * dVar10;
        dVar32 = dVar149 * 0.053425 + 1.0;
        dVar164 = SQRT(dVar149);
        local_df0 = dVar164;
        if (dVar149 < 0.0) {
          local_df0 = sqrt(dVar149);
        }
        dVar33 = dVar16 * local_b08;
        if (dVar149 < 0.0) {
          dVar164 = sqrt(dVar149);
        }
        dVar164 = dVar164 * dVar149;
        dVar120 = dVar79 * 2.080083823051904;
        dVar87 = 1.0 / (dVar16 * dVar16);
        dVar88 = dVar87 * 1.5874010519681996 * dVar120;
        dVar89 = dVar88 * 0.123235 + dVar164 * 0.204775 + local_df0 * 3.79785 + dVar149 * 0.8969;
        dVar34 = 16.081979498692537 / dVar89 + 1.0;
        dVar35 = log(dVar34);
        dVar36 = dVar35 * 0.0621814 * dVar32;
        dVar90 = dVar112 * dVar112;
        dVar91 = dVar90 * dVar90;
        dVar37 = dVar77 * dVar77;
        dVar38 = 1.0 / (dVar37 * dVar37);
        dVar92 = dVar91 * dVar38;
        dVar14 = (dVar14 + local_ce8 + -2.0) * 1.9236610509315362;
        dVar39 = dVar149 * 0.05137 + 1.0;
        dVar93 = dVar88 * 0.1562925 + dVar164 * 0.420775 + local_df0 * 7.05945 + dVar149 * 1.549425;
        dVar40 = 32.16395899738507 / dVar93 + 1.0;
        dVar41 = log(dVar40);
        dVar94 = dVar149 * 0.0278125 + 1.0;
        dVar95 = dVar88 * 0.1241775 + dVar164 * 0.1100325 + local_df0 * 5.1785 + dVar149 * 0.905775;
        dVar164 = 29.608749977793437 / dVar95 + 1.0;
        dVar42 = log(dVar164);
        dVar121 = dVar94 * dVar42 * -0.0197516734986138 + dVar41 * -0.0310907 * dVar39 + dVar36;
        dVar43 = dVar14 * dVar121;
        dVar96 = dVar94 * dVar42 * 0.0197516734986138;
        dVar97 = dVar96 * dVar14 + (dVar43 * dVar92 - dVar36);
        dVar88 = dVar88 * 0.25 + dVar149 * -0.225 + 3.2;
        dVar36 = 1.0 / dVar88;
        dVar122 = (dVar33 * -0.09375 * dVar15 * dVar11 - dVar119 * 0.09375 * dVar116 * dVar11) +
                  dVar36 * 3.4602 * dVar97;
        pdVar2 = out->zk;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar3 = (long)(p->dim).zk * sVar4;
          pdVar2[lVar3] = pdVar2[lVar3] + dVar122;
        }
        dVar44 = 1.0 / dVar37;
        dVar45 = dVar78 - dVar112 * dVar44;
        dVar46 = 0.0;
        if (dVar146 < __x_00) {
          dVar46 = dVar45 * 1.3333333333333333 * dVar13;
        }
        dVar47 = dVar46 * 1.5874010519681996;
        dVar123 = dVar87 * local_b08;
        dVar48 = dVar15 * dVar123 * dVar11;
        dVar49 = dVar48 * 0.03125;
        dVar221 = dVar221 * dVar254;
        dVar50 = dVar113 / dVar77;
        dVar51 = dVar50 * 1.4422495703074083;
        dVar150 = 1.0 / (dVar160 * dVar160);
        dVar139 = 1.0 / (dVar13 * dVar13);
        dVar140 = (double)(~uVar5 & (ulong)((dVar45 * dVar139) / 3.0));
        dVar180 = (dVar19 * dVar51 * dVar80) / -54.0;
        dVar151 = (dVar114 * dVar150 * dVar140 * dVar80) / -18.0 + dVar180;
        uVar7 = -(ulong)(1.92 < dVar138);
        dVar98 = (double)(uVar7 & (ulong)dVar151);
        dVar52 = dVar254 * dVar272;
        dVar272 = dVar272 * dVar221;
        dVar232 = 0.0;
        if (dVar138 <= 1.92) {
          dVar232 = dVar151;
        }
        dVar152 = 1.0 / dVar221;
        dVar261 = 1.0 / dVar272;
        dVar153 = 1.0 / (dVar254 * dVar163);
        dVar181 = 1.0 / (dVar221 * dVar163);
        dVar198 = 1.0 / (dVar163 * dVar52);
        dVar199 = 1.0 / (dVar163 * dVar272);
        dVar200 = dVar246 / dVar254;
        dVar201 = dVar246 / dVar272;
        dVar165 = dVar246 / (dVar254 * dVar163);
        dVar202 = dVar246 / (dVar221 * dVar163);
        dVar151 = dVar246 / (dVar163 * dVar52);
        dVar272 = dVar246 / (dVar163 * dVar272);
        dVar254 = dVar196 / dVar254;
        dVar141 = dVar246 / dVar221;
        dVar221 = dVar196 / dVar221;
        dVar222 = 1.0 / dVar52;
        dVar209 = dVar246 / dVar52;
        dVar52 = dVar196 / dVar52;
        dVar233 = 1.0 / (dVar17 * dVar81);
        dVar99 = 1.0 / dVar22;
        dVar124 = dVar270 * dVar233;
        dVar234 = dVar232 * dVar99;
        dVar23 = dVar23 * -2.0;
        dVar163 = dVar23 * dVar232 * dVar17 + dVar124 * (dVar234 + dVar234);
        dVar235 = dVar17 * dVar163 * 0.25 + (dVar232 * dVar82 * 0.25 - dVar21 * dVar99 * dVar232);
        if (dVar138 < 1.92) {
          dVar125 = dVar20 * -2.6666666666666665 * dVar232 + dVar235 * -2.6666666666666665 * dVar17;
        }
        else {
          dVar125 = dVar98 * 0.005120910384068279 * dVar52 +
                    dVar98 * -0.0056808688387635755 * dVar221 +
                    dVar98 * 0.006337888690829867 * dVar254 +
                    dVar98 * -0.007115749525616698 * dVar272 +
                    dVar98 * 0.008045977011494253 * dVar151 +
                    dVar98 * -0.009171075837742505 * dVar202 +
                    dVar98 * 0.01054945054945055 * dVar165 +
                    dVar98 * -0.012263099219620958 * dVar201 +
                    dVar98 * 0.01443001443001443 * dVar209 +
                    dVar98 * -0.01722488038277512 * dVar141 +
                    dVar98 * 0.02091503267973856 * dVar200 +
                    dVar98 * -0.025925925925925925 * dVar199 +
                    dVar98 * 0.03296703296703297 * dVar198 +
                    dVar98 * -0.04329004329004329 * dVar181 +
                    dVar98 * 0.05925925925925926 * dVar153 +
                    dVar98 * -0.08571428571428572 * dVar261 +
                    dVar98 * -0.2222222222222222 * dVar152 + dVar98 * 0.13333333333333333 * dVar222;
        }
        dVar100 = 1.0 / (dVar25 * dVar25);
        dVar182 = 0.0;
        if (dVar1 < __x) {
          dVar182 = (dVar100 * dVar45) / -3.0;
        }
        dVar53 = dVar16 * dVar125;
        dVar126 = (double)(~uVar6 & (ulong)(dVar45 * -1.3333333333333333 * dVar25));
        dVar54 = dVar126 * 1.5874010519681996;
        dVar127 = dVar87 * dVar179;
        dVar55 = dVar116 * dVar127 * dVar11;
        dVar56 = dVar55 * 0.03125;
        dVar197 = dVar197 * dVar129;
        dVar154 = 1.0 / (dVar67 * dVar67);
        dVar187 = (dVar51 * dVar26 * dVar80) / -54.0;
        dVar155 = (dVar114 * dVar154 * dVar182 * dVar80) / -18.0 + dVar187;
        uVar8 = -(ulong)(1.92 < dVar117);
        dVar101 = (double)(uVar8 & (ulong)dVar155);
        dVar57 = dVar129 * dVar273;
        dVar273 = dVar273 * dVar197;
        dVar236 = 0.0;
        if (dVar117 <= 1.92) {
          dVar236 = dVar155;
        }
        dVar274 = 1.0 / dVar197;
        dVar156 = 1.0 / dVar273;
        dVar203 = 1.0 / (dVar129 * dVar186);
        dVar247 = 1.0 / (dVar197 * dVar186);
        dVar166 = 1.0 / (dVar186 * dVar57);
        dVar167 = 1.0 / (dVar186 * dVar273);
        dVar255 = dVar162 / dVar129;
        dVar256 = dVar162 / dVar273;
        dVar168 = dVar162 / (dVar129 * dVar186);
        dVar155 = dVar162 / (dVar197 * dVar186);
        dVar223 = dVar162 / (dVar186 * dVar57);
        dVar128 = dVar162 / (dVar186 * dVar273);
        dVar129 = dVar231 / dVar129;
        dVar130 = dVar162 / dVar197;
        dVar197 = dVar231 / dVar197;
        dVar142 = 1.0 / dVar57;
        dVar183 = dVar162 / dVar57;
        dVar57 = dVar231 / dVar57;
        dVar262 = 1.0 / (dVar12 * dVar84);
        dVar169 = 1.0 / dVar29;
        dVar273 = dVar271 * dVar262;
        dVar131 = dVar169 * dVar236;
        dVar30 = dVar30 * -2.0;
        dVar186 = dVar30 * dVar236 * dVar12 + dVar273 * (dVar131 + dVar131);
        dVar170 = dVar12 * dVar186 * 0.25 + (dVar85 * dVar236 * 0.25 - dVar28 * dVar169 * dVar236);
        if (dVar117 < 1.92) {
          dVar143 = dVar170 * -2.6666666666666665 * dVar12 + dVar27 * -2.6666666666666665 * dVar236;
        }
        else {
          dVar143 = dVar101 * 0.005120910384068279 * dVar57 +
                    dVar101 * -0.0056808688387635755 * dVar197 +
                    dVar101 * 0.006337888690829867 * dVar129 +
                    dVar101 * -0.007115749525616698 * dVar128 +
                    dVar101 * 0.008045977011494253 * dVar223 +
                    dVar101 * -0.009171075837742505 * dVar155 +
                    dVar101 * 0.01054945054945055 * dVar168 +
                    dVar101 * -0.012263099219620958 * dVar256 +
                    dVar101 * 0.01443001443001443 * dVar183 +
                    dVar101 * -0.01722488038277512 * dVar130 +
                    dVar101 * 0.02091503267973856 * dVar255 +
                    dVar101 * -0.025925925925925925 * dVar167 +
                    dVar101 * 0.03296703296703297 * dVar166 +
                    dVar101 * -0.04329004329004329 * dVar247 +
                    dVar101 * 0.05925925925925926 * dVar203 +
                    dVar101 * -0.08571428571428572 * dVar156 +
                    dVar101 * -0.2222222222222222 * dVar274 +
                    dVar101 * 0.13333333333333333 * dVar142;
        }
        dVar58 = dVar15 * dVar53 * dVar11;
        dVar237 = dVar54 * dVar119 * dVar11;
        dVar59 = dVar47 * dVar33 * dVar11;
        dVar60 = dVar16 * dVar143;
        dVar102 = dVar116 * dVar60 * dVar11;
        dVar61 = dVar102 * 0.09375;
        dVar132 = dVar50 * 2.519842099789747;
        dVar62 = dVar35 * 0.0011073470983333333 * dVar132 * dVar10;
        dVar63 = dVar89 * dVar89;
        dVar64 = dVar32 * (1.0 / dVar63);
        dVar9 = dVar9 * 2.519842099789747;
        dVar103 = dVar9 * dVar50 * (1.4422495703074083 / local_df0);
        dVar65 = dVar10 * dVar132;
        if (dVar149 < 0.0) {
          dVar66 = sqrt(dVar149);
        }
        else {
          dVar66 = SQRT(dVar149);
        }
        dVar238 = dVar9 * dVar50 * dVar66 * 1.4422495703074083;
        dVar157 = dVar87 / dVar77;
        dVar158 = dVar157 * 1.5874010519681996 * dVar120;
        dVar104 = dVar158 * -0.08215666666666667 +
                  dVar238 * -0.1023875 + dVar103 * -0.632975 + dVar65 * -0.29896666666666666;
        dVar171 = 1.0 / dVar34;
        dVar224 = 1.0 / (dVar37 * dVar37 * dVar77);
        dVar105 = dVar93 * dVar93;
        dVar133 = dVar39 * (1.0 / dVar105);
        dVar106 = dVar158 * -0.104195 +
                  dVar238 * -0.2103875 + dVar103 * -1.176575 + dVar65 * -0.516475;
        dVar188 = 1.0 / dVar40;
        dVar238 = dVar158 * -0.082785 +
                  dVar238 * -0.05501625 + dVar103 * -0.8630833333333333 + dVar65 * -0.301925;
        dVar239 = dVar64 * dVar171 * dVar104;
        dVar107 = dVar95 * dVar95;
        dVar103 = 1.0 / dVar107;
        dVar108 = 1.0 / dVar164;
        dVar109 = dVar108 * dVar238;
        dVar210 = dVar109 * 0.5848223622634646 * dVar94 * dVar103 +
                  dVar42 * 0.00018311447306006544 * dVar132 * dVar10 +
                  (((dVar41 * 0.0005323764196666666 * dVar132 * dVar10 + dVar133 * dVar188 * dVar106
                    ) - dVar62) - dVar239);
        dVar239 = dVar239 + dVar62;
        dVar134 = dVar112 * dVar90 * dVar38;
        dVar135 = dVar134 * dVar43 * 4.0;
        dVar144 = dVar91 * dVar224;
        dVar263 = dVar43 * 4.0 * dVar144;
        dVar184 = (dVar46 + dVar126) * 1.9236610509315362;
        dVar172 = dVar184 * dVar121;
        dVar145 = dVar92 * dVar14 * dVar210;
        dVar275 = 1.0 / (dVar88 * dVar88);
        dVar62 = dVar65 * 0.075 + dVar158 / -6.0;
        dVar240 = dVar58 * 0.09375;
        dVar264 = dVar237 * 0.09375;
        dVar173 = dVar50 * dVar42 * dVar9;
        dVar174 = dVar173 * 0.00018311447306006544 * dVar14 * 1.4422495703074083;
        dVar248 = dVar94 * dVar14;
        dVar46 = dVar103 * dVar109;
        dVar65 = dVar46 * 0.5848223622634646 * dVar248;
        dVar211 = ((dVar96 * dVar184 + dVar172 * dVar92 + ((dVar135 + dVar239) - dVar263) + dVar145)
                  - dVar174) - dVar65;
        dVar126 = dVar36 * dVar211;
        dVar212 = dVar126 * 3.4602;
        dVar257 = dVar62 * dVar275 * dVar97;
        dVar158 = dVar257 * 3.4602;
        dVar204 = dVar59 * -0.09375;
        pdVar2 = out->vrho;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar3 = (long)(p->dim).vrho * sVar4;
          pdVar2[lVar3] =
               (((((((dVar204 - dVar49) - dVar240) - dVar264) - dVar56) - dVar61) + dVar212) -
               dVar158) * dVar77 + dVar122 + pdVar2[lVar3];
        }
        dVar78 = -dVar78 - dVar112 * dVar44;
        dVar189 = 0.0;
        if (dVar146 < __x_00) {
          dVar189 = dVar78 * 1.3333333333333333 * dVar13;
        }
        dVar213 = dVar189 * 1.5874010519681996;
        dVar214 = dVar213 * dVar33 * dVar11;
        dVar205 = (double)(~uVar5 & (ulong)((dVar78 * dVar139) / 3.0));
        dVar180 = dVar180 + (dVar114 * dVar150 * dVar205 * dVar80) / -18.0;
        dVar215 = dVar214 * 0.09375;
        dVar225 = 0.0;
        if (dVar138 <= 1.92) {
          dVar225 = dVar180;
        }
        dVar265 = -dVar99;
        dVar206 = dVar225 * dVar99;
        dVar276 = dVar23 * dVar225 * dVar17 + (dVar206 + dVar206) * dVar124;
        dVar216 = dVar17 * dVar276 * 0.25 + dVar265 * dVar21 * dVar225 + dVar225 * dVar82 * 0.25;
        dVar180 = (double)((ulong)dVar180 & uVar7);
        if (dVar138 < 1.92) {
          dVar277 = dVar20 * -2.6666666666666665 * dVar225 + dVar216 * -2.6666666666666665 * dVar17;
        }
        else {
          dVar277 = dVar180 * dVar52 * 0.005120910384068279 +
                    dVar180 * dVar221 * -0.0056808688387635755 +
                    dVar180 * dVar254 * 0.006337888690829867 +
                    dVar180 * dVar272 * -0.007115749525616698 +
                    dVar180 * dVar151 * 0.008045977011494253 +
                    dVar180 * dVar202 * -0.009171075837742505 +
                    dVar180 * dVar165 * 0.01054945054945055 +
                    dVar180 * dVar201 * -0.012263099219620958 +
                    dVar180 * dVar209 * 0.01443001443001443 +
                    dVar180 * dVar141 * -0.01722488038277512 +
                    dVar180 * dVar200 * 0.02091503267973856 +
                    dVar180 * dVar199 * -0.025925925925925925 +
                    dVar180 * dVar198 * 0.03296703296703297 +
                    dVar180 * dVar181 * -0.04329004329004329 +
                    dVar180 * dVar153 * 0.05925925925925926 +
                    dVar180 * dVar261 * -0.08571428571428572 +
                    dVar180 * -0.2222222222222222 * dVar152 +
                    dVar180 * dVar222 * 0.13333333333333333;
        }
        dVar190 = dVar100 * -dVar78;
        dVar241 = 0.0;
        if (dVar1 < __x) {
          dVar241 = dVar190 / 3.0;
        }
        dVar110 = (double)(~uVar6 & (ulong)(dVar78 * -1.3333333333333333 * dVar25));
        dVar187 = dVar187 + (dVar114 * dVar154 * dVar241 * dVar80) / -18.0;
        dVar191 = dVar110 * 1.5874010519681996;
        dVar217 = 0.0;
        if (dVar117 <= 1.92) {
          dVar217 = dVar187;
        }
        dVar226 = dVar16 * dVar277;
        dVar192 = dVar15 * dVar226 * dVar11;
        dVar193 = dVar169 * dVar217;
        dVar227 = dVar30 * dVar217 * dVar12 + (dVar193 + dVar193) * dVar273;
        dVar194 = dVar12 * dVar227 * 0.25 + -dVar169 * dVar28 * dVar217 + dVar85 * dVar217 * 0.25;
        dVar228 = dVar191 * dVar119 * dVar11;
        dVar187 = (double)((ulong)dVar187 & uVar8);
        if (dVar117 < 1.92) {
          dVar249 = dVar194 * -2.6666666666666665 * dVar12 + dVar27 * -2.6666666666666665 * dVar217;
        }
        else {
          dVar249 = dVar187 * dVar57 * 0.005120910384068279 +
                    dVar187 * dVar197 * -0.0056808688387635755 +
                    dVar187 * dVar129 * 0.006337888690829867 +
                    dVar187 * dVar128 * -0.007115749525616698 +
                    dVar187 * dVar223 * 0.008045977011494253 +
                    dVar187 * dVar155 * -0.009171075837742505 +
                    dVar187 * dVar168 * 0.01054945054945055 +
                    dVar187 * dVar256 * -0.012263099219620958 +
                    dVar187 * dVar183 * 0.01443001443001443 +
                    dVar187 * dVar130 * -0.01722488038277512 +
                    dVar187 * dVar255 * 0.02091503267973856 +
                    dVar187 * dVar167 * -0.025925925925925925 +
                    dVar187 * dVar166 * 0.03296703296703297 +
                    dVar187 * dVar247 * -0.04329004329004329 +
                    dVar187 * dVar203 * 0.05925925925925926 +
                    dVar187 * dVar156 * -0.08571428571428572 +
                    dVar187 * -0.2222222222222222 * dVar274 +
                    dVar187 * dVar142 * 0.13333333333333333;
        }
        dVar250 = dVar192 * 0.09375;
        dVar278 = dVar228 * 0.09375;
        dVar218 = dVar16 * dVar249;
        dVar266 = (dVar189 + dVar110) * 1.9236610509315362;
        dVar189 = dVar266 * dVar121;
        dVar110 = dVar116 * dVar218 * dVar11;
        dVar111 = dVar110 * 0.09375;
        dVar65 = ((dVar96 * dVar266 + dVar189 * dVar92 + ((dVar239 - dVar135) - dVar263) + dVar145)
                 - dVar174) - dVar65;
        dVar135 = dVar36 * dVar65;
        dVar145 = dVar135 * 3.4602;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar3 = (long)(p->dim).vrho * sVar4;
          pdVar2[lVar3 + 1] =
               (((((((-dVar215 - dVar49) - dVar250) - dVar278) - dVar56) - dVar111) + dVar145) -
               dVar158) * dVar77 + dVar122 + pdVar2[lVar3 + 1];
        }
        dVar257 = dVar257 * 6.9204;
        dVar239 = dVar45 * dVar45;
        dVar122 = 1.0 / (dVar77 * dVar37);
        dVar56 = dVar112 * dVar122 + dVar112 * dVar122;
        dVar158 = dVar56 - (dVar44 + dVar44);
        dVar174 = 0.0;
        dVar49 = 0.0;
        if (dVar146 < __x_00) {
          dVar49 = dVar239 * 0.4444444444444444 * dVar139 + dVar158 * 1.3333333333333333 * dVar13;
        }
        dVar263 = (local_b08 * dVar157 * dVar15 * dVar11) / 48.0;
        dVar279 = dVar113 / dVar37;
        dVar159 = dVar19 * 0.024691358024691357 * dVar279 * 1.4422495703074083 * dVar80;
        dVar185 = dVar150 * dVar140 * dVar51 * dVar80;
        dVar160 = dVar150 / dVar160;
        dVar19 = dVar139 / __x_00;
        if (dVar146 < __x_00) {
          dVar174 = dVar239 * dVar19 * -0.2222222222222222 + (dVar139 * dVar158) / 3.0;
        }
        dVar136 = (dVar174 * dVar150 * dVar114 * dVar80) / -18.0 +
                  (dVar140 * dVar140 * dVar160 * dVar114 * dVar80) / 9.0 + dVar185 / 27.0 + dVar159;
        dVar259 = dVar196 / dVar259;
        dVar242 = 1.0 / (dVar81 * dVar81);
        dVar174 = dVar242 / dVar17;
        dVar267 = 1.0 / (dVar22 * dVar22);
        dVar22 = dVar270 * dVar242;
        dVar270 = (dVar242 / dVar81) * dVar270;
        local_4b8 = auVar243._0_8_;
        local_478 = auVar195._0_8_;
        local_4c8 = auVar251._0_8_;
        dStack_4c0 = auVar251._8_8_;
        local_4a8 = auVar220._0_8_;
        dStack_4a0 = auVar220._8_8_;
        local_448 = auVar147._0_8_;
        dStack_440 = auVar147._8_8_;
        local_488 = auVar207._0_8_;
        dStack_480 = auVar207._8_8_;
        if (dVar138 < 1.92) {
          dVar81 = dVar232 * dVar232;
          dVar136 = (double)(~uVar7 & (ulong)dVar136);
          dVar81 = ((dVar81 * dVar267 * 4.0 * dVar270 +
                    dVar81 * dVar99 * -6.0 * dVar22 +
                    (dVar99 * dVar136 + dVar99 * dVar136) * dVar124 +
                    dVar81 * dVar99 * 8.0 * dVar21 + dVar23 * dVar136 * dVar17 + dVar23 * dVar81) *
                    dVar17 * 0.25 +
                   dVar82 * dVar136 * 0.25 +
                   ((dVar21 * dVar136 * dVar265 + dVar233 * dVar81 * (dVar99 + dVar99)) -
                   dVar174 * (dVar267 + dVar267) * dVar81) + dVar163 * dVar232 * 0.5) *
                   -2.6666666666666665 * dVar17 +
                   dVar20 * -2.6666666666666665 * dVar136 + dVar235 * -5.333333333333333 * dVar232;
        }
        else {
          dVar136 = (double)((ulong)dVar136 & uVar7);
          dVar81 = dVar98 * dVar98;
          dVar81 = local_4b8 * dVar81 * -0.42857142857142855 +
                   dVar253 * dVar81 * 0.47619047619047616 +
                   dVar24 * dVar81 * -0.5333333333333333 +
                   dVar115 * dVar81 * 0.6 +
                   dVar177 * -(dVar81 * 0.6666666666666666) +
                   dVar83 * dVar81 * 0.6666666666666666 +
                   dVar165 * dVar136 * 0.01054945054945055 +
                   dVar201 * dVar136 * -0.012263099219620958 +
                   dVar209 * dVar136 * 0.01443001443001443 +
                   dVar141 * dVar136 * -0.01722488038277512 +
                   dVar200 * dVar136 * 0.02091503267973856 +
                   dVar199 * dVar136 * -0.025925925925925925 +
                   dVar198 * dVar136 * 0.03296703296703297 +
                   dVar181 * dVar136 * -0.04329004329004329 +
                   dVar153 * dVar136 * 0.05925925925925926 +
                   dVar261 * dVar136 * -0.08571428571428572 +
                   dVar152 * dVar136 * -0.2222222222222222 + dVar222 * dVar136 * 0.13333333333333333
                   + dVar52 * dVar136 * 0.005120910384068279 +
                     dVar221 * dVar136 * -0.0056808688387635755 +
                     dVar254 * dVar136 * 0.006337888690829867 +
                     dVar272 * dVar136 * -0.007115749525616698 +
                     dVar151 * dVar136 * 0.008045977011494253 +
                     dVar202 * dVar136 * -0.009171075837742505 +
                     dVar259 * dVar81 * -0.18947368421052632 +
                     dStack_480 * dVar81 * 0.19883040935672514 +
                     local_488 * dVar81 * -0.20915032679738563 +
                     dVar196 * dVar81 * 0.22058823529411764 +
                     local_478 * dVar81 * -0.23333333333333334 +
                     dStack_440 * dVar81 * 0.24761904761904763 +
                     local_448 * dVar81 * -0.26373626373626374 +
                     dStack_4a0 * dVar81 * 0.28205128205128205 +
                     local_4a8 * dVar81 * -0.30303030303030304 +
                     dStack_4c0 * dVar81 * 0.32727272727272727 +
                     dVar246 * dVar81 * 0.3888888888888889 +
                     local_4c8 * dVar81 * -0.35555555555555557;
        }
        dVar136 = 0.0;
        dVar242 = 0.0;
        if (dVar1 < __x) {
          dVar242 = dVar239 * 0.4444444444444444 * dVar100 + dVar158 * -1.3333333333333333 * dVar25;
        }
        dVar179 = (dVar157 * dVar179 * dVar116 * dVar11) / 48.0;
        dVar280 = dVar279 * 1.4422495703074083 * dVar26 * 0.024691358024691357 * dVar80;
        dVar157 = dVar154 * dVar182 * dVar51 * dVar80;
        dVar67 = dVar154 / dVar67;
        dVar26 = dVar100 / __x;
        if (dVar1 < __x) {
          dVar136 = dVar239 * dVar26 * -0.2222222222222222 + (-dVar158 * dVar100) / 3.0;
        }
        dVar239 = (dVar136 * dVar154 * dVar114 * dVar80) / -18.0 +
                  (dVar182 * dVar182 * dVar67 * dVar114 * dVar80) / 9.0 + dVar157 / 27.0 + dVar280;
        dVar260 = dVar231 / dVar260;
        dVar136 = 1.0 / (dVar84 * dVar84);
        dVar158 = dVar136 / dVar12;
        dVar29 = 1.0 / (dVar29 * dVar29);
        dVar268 = dVar271 * dVar136;
        dVar271 = (dVar136 / dVar84) * dVar271;
        local_3b8 = auVar68._0_8_;
        local_408 = auVar70._0_8_;
        local_438 = auVar148._0_8_;
        dStack_430 = auVar148._8_8_;
        local_5f8 = auVar72._0_8_;
        dStack_5f0 = auVar72._8_8_;
        local_3d8 = auVar69._0_8_;
        dStack_3d0 = auVar69._8_8_;
        local_418 = auVar71._0_8_;
        dStack_410 = auVar71._8_8_;
        if (dVar117 < 1.92) {
          dVar84 = dVar236 * dVar236;
          dVar239 = (double)(~uVar8 & (ulong)dVar239);
          dVar84 = ((dVar29 * dVar84 * 4.0 * dVar271 +
                    (dVar169 * dVar239 + dVar169 * dVar239) * dVar273 +
                    dVar169 * dVar84 * -6.0 * dVar268 +
                    dVar84 * dVar30 + dVar30 * dVar239 * dVar12 + dVar169 * 8.0 * dVar84 * dVar28) *
                    dVar12 * 0.25 +
                   dVar85 * dVar239 * 0.25 +
                   ((dVar28 * dVar239 * -dVar169 + dVar262 * dVar84 * (dVar169 + dVar169)) -
                   dVar158 * (dVar29 + dVar29) * dVar84) + dVar186 * dVar236 * 0.5) *
                   -2.6666666666666665 * dVar12 +
                   dVar27 * -2.6666666666666665 * dVar239 + dVar170 * -5.333333333333333 * dVar236;
        }
        else {
          dVar84 = dVar101 * dVar101;
          dVar239 = (double)((ulong)dVar239 & uVar8);
          dVar84 = dVar239 * dVar168 * 0.01054945054945055 +
                   dVar239 * dVar256 * -0.012263099219620958 +
                   dVar239 * dVar183 * 0.01443001443001443 +
                   dVar239 * dVar130 * -0.01722488038277512 +
                   dVar239 * dVar255 * 0.02091503267973856 +
                   dVar239 * dVar167 * -0.025925925925925925 +
                   dVar239 * dVar166 * 0.03296703296703297 +
                   dVar239 * dVar247 * -0.04329004329004329 +
                   dVar239 * dVar203 * 0.05925925925925926 +
                   dVar239 * dVar156 * -0.08571428571428572 +
                   dVar239 * dVar142 * 0.13333333333333333 +
                   dVar274 * dVar239 * -0.2222222222222222 +
                   dVar57 * dVar239 * 0.005120910384068279 +
                   dVar197 * dVar239 * -0.0056808688387635755 +
                   dVar129 * dVar239 * 0.006337888690829867 +
                   dVar128 * dVar239 * -0.007115749525616698 +
                   dVar239 * dVar155 * -0.009171075837742505 +
                   dVar223 * dVar239 * 0.008045977011494253 +
                   dVar260 * dVar84 * -0.18947368421052632 +
                   dStack_410 * dVar84 * 0.19883040935672514 +
                   local_418 * dVar84 * -0.20915032679738563 +
                   dVar231 * dVar84 * 0.22058823529411764 +
                   local_408 * dVar84 * -0.23333333333333334 +
                   dStack_3d0 * dVar84 * 0.24761904761904763 +
                   local_3d8 * dVar84 * -0.26373626373626374 +
                   dStack_5f0 * dVar84 * 0.28205128205128205 +
                   local_5f8 * dVar84 * -0.30303030303030304 +
                   dStack_430 * dVar84 * 0.32727272727272727 +
                   local_438 * dVar84 * -0.35555555555555557 +
                   dVar162 * dVar84 * 0.3888888888888889 +
                   local_3b8 * dVar84 * -0.42857142857142855 +
                   dVar178 * dVar84 * 0.47619047619047616 +
                   dVar31 * dVar84 * -0.5333333333333333 +
                   dVar118 * dVar84 * 0.6 +
                   dVar86 * dVar84 * 0.6666666666666666 + dVar208 * -(dVar84 * 0.6666666666666666);
        }
        dVar239 = 1.0 / (dVar107 * dVar107);
        dVar238 = dVar238 * dVar238;
        dVar164 = 1.0 / (dVar164 * dVar164);
        dVar79 = dVar79 * 1.5874010519681996 * (dVar87 / dVar37);
        dVar269 = ((2.080083823051904 / local_df0) / dVar149) * dVar79;
        dVar229 = (1.4422495703074083 / local_df0) * dVar9 * dVar279;
        dVar137 = dVar279 * 2.519842099789747;
        dVar136 = dVar10 * dVar137;
        if (dVar149 < 0.0) {
          dVar149 = sqrt(dVar149);
        }
        else {
          dVar149 = SQRT(dVar149);
        }
        dVar79 = dVar79 * (1.0 / dVar149) * 2.080083823051904;
        dVar161 = dVar9 * dVar279 * dVar66 * 1.4422495703074083;
        dVar120 = dVar120 * (dVar87 / dVar37) * 1.5874010519681996;
        dVar149 = dVar171 * dVar104 * dVar104;
        dVar66 = (dVar149 + dVar149) * (1.0 / (dVar89 * dVar63)) * dVar32;
        dVar64 = dVar64 * (dVar120 * 0.1369277777777778 +
                          dVar161 * 0.13651666666666668 +
                          dVar79 * 0.06825833333333334 +
                          dVar136 * 0.3986222222222222 +
                          dVar269 * -0.4219833333333333 + dVar229 * 0.8439666666666666) * dVar171;
        dVar219 = (1.0 / (dVar34 * dVar34)) * dVar104 * dVar104 * 16.081979498692537 *
                  (1.0 / (dVar63 * dVar63)) * dVar32;
        dVar281 = 1.0 / (dVar95 * dVar107);
        dVar107 = (dVar120 * 0.137975 +
                  dVar161 * 0.073355 +
                  dVar79 * 0.0366775 +
                  dVar136 * 0.4025666666666667 +
                  dVar269 * -0.5753888888888888 + dVar229 * 1.1507777777777777) * dVar108;
        dVar35 = dVar35 * 0.0014764627977777779 * dVar137 * dVar10;
        dVar104 = dVar171 * dVar104 * 0.035616666666666665 * (1.0 / dVar63) * dVar50 * dVar11;
        dVar89 = dVar239 * dVar238 * dVar164 * 17.315859105681465 * dVar248;
        dVar95 = dVar103 * dVar107 * 0.5848223622634646 * dVar248;
        dVar248 = dVar108 * dVar238 * dVar281 * 1.1696447245269292 * dVar248;
        dVar32 = dVar132 * dVar46 * 0.01084358130030174 * dVar10 * dVar14;
        dVar9 = dVar14 * 1.4422495703074083 * dVar9 * dVar279 * dVar42 * 0.00024415263074675396;
        dVar63 = dVar43 * 12.0 * dVar90 * dVar38;
        dVar132 = dVar43 * 32.0 * dVar112 * dVar90 * dVar224;
        dVar171 = dVar47 * dVar123 * dVar11;
        dVar149 = dVar125 * dVar87 * dVar15 * dVar11;
        dVar125 = dVar54 * dVar127 * dVar11;
        dVar34 = dVar143 * dVar87 * dVar116 * dVar11;
        dVar48 = dVar48 * 0.0625;
        dVar55 = dVar55 * 0.0625;
        dVar90 = dVar94 * dVar184 * dVar46;
        dVar79 = (dVar164 * dVar238 * 17.315859105681465 * dVar239 * dVar94 +
                 dVar107 * 0.5848223622634646 * dVar94 * dVar103 +
                 dVar108 * dVar238 * -1.1696447245269292 * dVar94 * dVar281 +
                 dVar109 * -0.01084358130030174 * dVar50 * dVar103 * dVar11 +
                 dVar42 * -0.00024415263074675396 * dVar137 * dVar10 +
                 ((((1.0 / (dVar40 * dVar40)) * dVar106 * dVar106 * 32.16395899738507 *
                    (1.0 / (dVar105 * dVar105)) * dVar39 +
                    (dVar120 * 0.17365833333333333 +
                    dVar161 * 0.2805166666666667 +
                    dVar79 * 0.14025833333333335 +
                    dVar136 * 0.6886333333333333 +
                    dVar269 * -0.7843833333333333 + dVar229 * 1.5687666666666666) * dVar188 *
                    dVar133 + dVar188 * dVar106 * dVar106 * -2.0 *
                              (1.0 / (dVar93 * dVar105)) * dVar39 +
                              dVar41 * -0.0007098352262222222 * dVar137 * dVar10 +
                              dVar188 * dVar106 * -0.03424666666666667 * (1.0 / dVar105) * dVar50 *
                              dVar11 + dVar35 + dVar104 + dVar66) - dVar64) - dVar219)) * dVar14 *
                 dVar92;
        dVar42 = (dVar49 + dVar242) * 1.9236610509315362;
        dVar164 = dVar184 * dVar210 * dVar92;
        dVar10 = dVar43 * 20.0 * dVar91 * (dVar38 / dVar37);
        dVar37 = dVar14 * dVar210 * 8.0;
        dVar14 = dVar144 * dVar37;
        dVar37 = dVar37 * dVar134;
        dVar38 = dVar184 * 1.4422495703074083 * dVar173;
        dVar39 = dVar211 * dVar275 * dVar62;
        dVar40 = dVar62 * dVar62 * (dVar275 / dVar88) * dVar97 * 6.9204;
        dVar41 = (dVar136 * -0.1 + dVar120 * 0.2777777777777778) * dVar275 * dVar97 * 3.4602;
        pdVar2 = out->v2rho2;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar3 = (long)(p->dim).v2rho2 * sVar4;
          pdVar2[lVar3] =
               (((((((((((((((dVar49 * 1.5874010519681996 * dVar33 * dVar11 * -0.09375 -
                             dVar171 * 0.0625) - dVar47 * dVar53 * dVar11 * 0.1875) + dVar263) -
                          dVar149 * 0.0625) - dVar81 * dVar16 * dVar15 * dVar11 * 0.09375) -
                        dVar242 * 1.5874010519681996 * dVar119 * dVar11 * 0.09375) -
                       dVar125 * 0.0625) - dVar54 * dVar60 * dVar11 * 0.1875) + dVar179) -
                    dVar34 * 0.0625) - dVar84 * dVar16 * dVar116 * dVar11 * 0.09375) +
                  (((((((dVar38 * -0.0003662289461201309 +
                        ((dVar172 * dVar134 * 8.0 + dVar37) - dVar66) + dVar248) - dVar104) + dVar32
                      + dVar9) - dVar35) + dVar63) - dVar132) + dVar10 +
                  dVar42 * dVar96 +
                  ((dVar144 * dVar172 * -8.0 +
                   dVar164 + dVar164 +
                   dVar121 * dVar42 * dVar92 +
                   dVar90 * -1.1696447245269292 + (-dVar89 - dVar95) + dVar79) - dVar14) + dVar64 +
                  dVar219) * dVar36 * 3.4602) - dVar39 * 6.9204) + dVar40) - dVar41) * dVar77 +
               ((dVar126 * 6.9204 +
                dVar102 * -0.1875 +
                ((dVar237 * -0.1875 + dVar58 * -0.1875 + (dVar59 * -0.1875 - dVar48)) - dVar55)) -
               dVar257) + pdVar2[lVar3];
        }
        dVar84 = 0.0;
        dVar81 = 0.0;
        if (dVar146 < __x_00) {
          dVar81 = dVar45 * 0.4444444444444444 * dVar78 * dVar139 +
                   dVar122 * 2.6666666666666665 * dVar112 * dVar13;
        }
        dVar42 = dVar150 * dVar205 * dVar51 * dVar80;
        dVar18 = dVar18 * p->cam_omega * 1.4422495703074083;
        if (dVar146 < __x_00) {
          dVar84 = dVar122 * 0.6666666666666666 * dVar112 * dVar139 +
                   dVar45 * -0.2222222222222222 * dVar78 * dVar19;
        }
        dVar84 = (dVar84 * dVar150 * dVar114 * dVar80) / -18.0 +
                 (dVar113 * dVar160 * dVar140 * dVar205 * dVar18) / 9.0 +
                 dVar42 / 54.0 + dVar185 / 54.0 + dVar159;
        if (dVar138 < 1.92) {
          dVar84 = (double)(~uVar7 & (ulong)dVar84);
          dVar163 = dVar235 * -2.6666666666666665 * dVar225 +
                    dVar216 * -2.6666666666666665 * dVar232 +
                    dVar20 * -2.6666666666666665 * dVar84 +
                    ((dVar234 * 8.0 * dVar21 * dVar225 +
                     dVar225 * dVar267 * dVar232 * 4.0 * dVar270 +
                     (dVar99 * dVar84 + dVar99 * dVar84) * dVar124 +
                     dVar206 * dVar232 * -6.0 * dVar22 +
                     dVar23 * dVar84 * dVar17 + dVar23 * dVar225 * dVar232) * dVar17 * 0.25 +
                    dVar84 * dVar82 * 0.25 +
                    dVar21 * dVar84 * dVar265 + dVar225 * dVar233 * (dVar234 + dVar234) +
                    dVar225 * dVar174 * dVar232 * dVar267 * -2.0 + dVar163 * dVar225 * 0.25 +
                    dVar276 * dVar232 * 0.25) * -2.6666666666666665 * dVar17;
        }
        else {
          dVar84 = (double)((ulong)dVar84 & uVar7);
          dVar163 = dVar254 * dVar84 * 0.006337888690829867 +
                    dVar272 * dVar84 * -0.007115749525616698 +
                    dVar151 * dVar84 * 0.008045977011494253 +
                    dVar202 * dVar84 * -0.009171075837742505 +
                    dVar165 * dVar84 * 0.01054945054945055 +
                    dVar201 * dVar84 * -0.012263099219620958 +
                    dVar209 * dVar84 * 0.01443001443001443 +
                    dVar141 * dVar84 * -0.01722488038277512 +
                    dVar200 * dVar84 * 0.02091503267973856 +
                    dVar199 * dVar84 * -0.025925925925925925 +
                    dVar198 * dVar84 * 0.03296703296703297 +
                    dVar181 * dVar84 * -0.04329004329004329 +
                    dVar84 * dVar153 * 0.05925925925925926 +
                    dVar84 * dVar261 * -0.08571428571428572 +
                    dVar222 * dVar84 * 0.13333333333333333 +
                    dVar152 * dVar84 * -0.2222222222222222 +
                    dVar221 * dVar84 * -0.0056808688387635755 +
                    dVar52 * dVar84 * 0.005120910384068279 +
                    dVar180 * local_478 * dVar98 * -0.23333333333333334 +
                    dStack_440 * dVar180 * dVar98 * 0.24761904761904763 +
                    dVar180 * local_448 * dVar98 * -0.26373626373626374 +
                    dStack_4a0 * dVar180 * dVar98 * 0.28205128205128205 +
                    dVar180 * local_4a8 * dVar98 * -0.30303030303030304 +
                    dStack_4c0 * dVar180 * dVar98 * 0.32727272727272727 +
                    dVar180 * local_4c8 * dVar98 * -0.35555555555555557 +
                    dVar246 * dVar180 * dVar98 * 0.3888888888888889 +
                    dVar180 * local_4b8 * dVar98 * -0.42857142857142855 +
                    dVar180 * dVar253 * dVar98 * 0.47619047619047616 +
                    dVar180 * dVar24 * dVar98 * -0.5333333333333333 +
                    dVar180 * dVar115 * dVar98 * 0.6 +
                    -(dVar98 * 0.6666666666666666) * dVar177 * dVar180 +
                    dVar98 * 0.6666666666666666 * dVar83 * dVar180 +
                    dVar180 * dVar259 * dVar98 * -0.18947368421052632 +
                    dStack_480 * dVar180 * dVar98 * 0.19883040935672514 +
                    dVar196 * dVar180 * dVar98 * 0.22058823529411764 +
                    dVar180 * local_488 * dVar98 * -0.20915032679738563;
        }
        dVar43 = 0.0;
        dVar84 = 0.0;
        if (dVar1 < __x) {
          dVar84 = dVar45 * -0.4444444444444444 * dVar190 +
                   dVar122 * -2.6666666666666665 * dVar112 * dVar25;
        }
        dVar120 = dVar51 * dVar154 * dVar241 * dVar80;
        if (dVar1 < __x) {
          dVar43 = dVar122 * -0.6666666666666666 * dVar112 * dVar100 +
                   dVar45 * 0.2222222222222222 * -dVar78 * dVar26;
        }
        dVar112 = (dVar43 * dVar154 * dVar114 * dVar80) / -18.0 +
                  (dVar113 * dVar67 * dVar182 * dVar241 * dVar18) / 9.0 +
                  dVar120 / 54.0 + dVar157 / 54.0 + dVar280;
        if (dVar117 < 1.92) {
          dVar112 = (double)(~uVar8 & (ulong)dVar112);
          dVar112 = dVar170 * -2.6666666666666665 * dVar217 +
                    dVar194 * -2.6666666666666665 * dVar236 +
                    dVar27 * -2.6666666666666665 * dVar112 +
                    ((dVar131 * 8.0 * dVar28 * dVar217 +
                     (dVar169 * dVar112 + dVar169 * dVar112) * dVar273 +
                     dVar217 * dVar29 * dVar236 * 4.0 * dVar271 +
                     dVar193 * dVar236 * -6.0 * dVar268 +
                     dVar30 * dVar112 * dVar12 + dVar30 * dVar217 * dVar236) * dVar12 * 0.25 +
                    dVar112 * dVar85 * 0.25 +
                    dVar28 * dVar112 * -dVar169 + dVar262 * dVar217 * (dVar131 + dVar131) +
                    dVar158 * dVar217 * dVar236 * dVar29 * -2.0 + dVar186 * dVar217 * 0.25 +
                    dVar227 * dVar236 * 0.25) * -2.6666666666666665 * dVar12;
        }
        else {
          dVar112 = (double)((ulong)dVar112 & uVar8);
          dVar112 = dVar129 * dVar112 * 0.006337888690829867 +
                    dVar128 * dVar112 * -0.007115749525616698 +
                    dVar223 * dVar112 * 0.008045977011494253 +
                    dVar155 * dVar112 * -0.009171075837742505 +
                    dVar168 * dVar112 * 0.01054945054945055 +
                    dVar256 * dVar112 * -0.012263099219620958 +
                    dVar183 * dVar112 * 0.01443001443001443 +
                    dVar130 * dVar112 * -0.01722488038277512 +
                    dVar112 * dVar255 * 0.02091503267973856 +
                    dVar112 * dVar167 * -0.025925925925925925 +
                    dVar166 * dVar112 * 0.03296703296703297 +
                    dVar247 * dVar112 * -0.04329004329004329 +
                    dVar203 * dVar112 * 0.05925925925925926 +
                    dVar156 * dVar112 * -0.08571428571428572 +
                    dVar142 * dVar112 * 0.13333333333333333 +
                    dVar274 * dVar112 * -0.2222222222222222 +
                    dVar197 * dVar112 * -0.0056808688387635755 +
                    dVar57 * dVar112 * 0.005120910384068279 +
                    dVar187 * local_5f8 * dVar101 * -0.30303030303030304 +
                    dStack_430 * dVar187 * dVar101 * 0.32727272727272727 +
                    dVar187 * local_438 * dVar101 * -0.35555555555555557 +
                    dVar162 * dVar187 * dVar101 * 0.3888888888888889 +
                    dVar187 * local_3b8 * dVar101 * -0.42857142857142855 +
                    dVar187 * dVar178 * dVar101 * 0.47619047619047616 +
                    dVar187 * dVar31 * dVar101 * -0.5333333333333333 +
                    dVar187 * dVar118 * dVar101 * 0.6 +
                    -(dVar101 * 0.6666666666666666) * dVar208 * dVar187 +
                    dVar101 * 0.6666666666666666 * dVar187 * dVar86 +
                    dVar187 * dVar260 * dVar101 * -0.18947368421052632 +
                    dStack_410 * dVar187 * dVar101 * 0.19883040935672514 +
                    dVar187 * local_418 * dVar101 * -0.20915032679738563 +
                    dVar231 * dVar187 * dVar101 * 0.22058823529411764 +
                    dVar187 * local_408 * dVar101 * -0.23333333333333334 +
                    dStack_3d0 * dVar187 * dVar101 * 0.24761904761904763 +
                    dStack_5f0 * dVar187 * dVar101 * 0.28205128205128205 +
                    dVar187 * local_3d8 * dVar101 * -0.26373626373626374;
        }
        dVar46 = dVar94 * dVar266 * dVar46;
        dVar43 = (dVar81 + dVar84) * 1.9236610509315362;
        dVar173 = dVar266 * 1.4422495703074083 * dVar173;
        dVar186 = dVar210 * dVar266 * dVar92;
        dVar62 = dVar62 * dVar275 * dVar65;
        dVar88 = dVar123 * dVar213 * dVar11;
        dVar91 = dVar277 * dVar87 * dVar15 * dVar11;
        dVar18 = dVar127 * dVar191 * dVar11;
        dVar113 = dVar249 * dVar87 * dVar116 * dVar11;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar3 = (long)(p->dim).v2rho2 * sVar4;
          pdVar2[lVar3 + 1] =
               (((dVar39 * -3.4602 +
                  dVar62 * -3.4602 +
                  (((dVar144 * dVar172 * -4.0 +
                    dVar164 + ((dVar38 * -0.00018311447306006544 +
                                ((dVar173 * -0.00018311447306006544 +
                                  dVar172 * dVar134 * -4.0 + (dVar10 - dVar63) + dVar9) - dVar104) +
                                dVar32 + dVar79) - dVar35)) - dVar14) +
                  dVar121 * dVar43 * dVar92 +
                  dVar144 * dVar189 * -4.0 +
                  dVar134 * dVar189 * 4.0 +
                  dVar46 * -0.5848223622634646 +
                  (((((dVar43 * dVar96 + dVar90 * -0.5848223622634646) - dVar89) - dVar95) + dVar64
                   + dVar219) - dVar66) + dVar248 + dVar186) * dVar36 * 3.4602 +
                  dVar112 * dVar16 * dVar116 * dVar11 * -0.09375 +
                  dVar113 * -0.03125 +
                  dVar54 * dVar218 * dVar11 * -0.09375 +
                  dVar34 * -0.03125 +
                  dVar60 * dVar191 * dVar11 * -0.09375 + dVar125 * -0.03125 + dVar179 + dVar40) -
                dVar41) +
               dVar18 * -0.03125 +
               dVar84 * 1.5874010519681996 * dVar119 * dVar11 * -0.09375 +
               dVar163 * dVar16 * dVar15 * dVar11 * -0.09375 +
               dVar91 * -0.03125 +
               dVar47 * dVar226 * dVar11 * -0.09375 +
               dVar149 * -0.03125 +
               dVar171 * -0.03125 +
               dVar53 * dVar213 * dVar11 * -0.09375 +
               dVar81 * 1.5874010519681996 * dVar33 * dVar11 * -0.09375 + dVar88 * -0.03125 +
               dVar263) * dVar77 +
               dVar145 + (((((((((((dVar204 - dVar48) - dVar240) - dVar264) - dVar55) - dVar61) +
                              dVar212) - dVar257) - dVar215) - dVar250) - dVar278) - dVar111) +
               pdVar2[lVar3 + 1];
        }
        dVar78 = dVar78 * dVar78;
        dVar56 = dVar44 + dVar44 + dVar56;
        dVar112 = 0.0;
        dVar81 = 0.0;
        if (dVar146 < __x_00) {
          dVar81 = dVar78 * 0.4444444444444444 * dVar139 + dVar13 * dVar56 * 1.3333333333333333;
        }
        if (dVar146 < __x_00) {
          dVar112 = dVar19 * dVar78 * -0.2222222222222222 + (dVar139 * dVar56) / 3.0;
        }
        dVar146 = (dVar150 * dVar112 * dVar114 * dVar80) / -18.0 +
                  (dVar160 * dVar205 * dVar205 * dVar114 * dVar80) / 9.0 + dVar159 + dVar42 / 27.0;
        if (dVar138 < 1.92) {
          dVar146 = (double)(~uVar7 & (ulong)dVar146);
          dVar13 = dVar225 * dVar225;
          dVar146 = ((dVar267 * dVar13 * 4.0 * dVar270 +
                     (dVar99 * dVar146 + dVar99 * dVar146) * dVar124 +
                     dVar13 * dVar99 * -6.0 * dVar22 +
                     dVar13 * dVar23 + dVar23 * dVar146 * dVar17 + dVar99 * 8.0 * dVar13 * dVar21) *
                     dVar17 * 0.25 +
                    dVar82 * dVar146 * 0.25 +
                    ((dVar265 * dVar21 * dVar146 + dVar233 * dVar13 * (dVar99 + dVar99)) -
                    (dVar267 + dVar267) * dVar174 * dVar13) + dVar276 * dVar225 * 0.5) *
                    -2.6666666666666665 * dVar17 +
                    dVar20 * -2.6666666666666665 * dVar146 + dVar216 * -5.333333333333333 * dVar225;
        }
        else {
          dVar146 = (double)(uVar7 & (ulong)dVar146);
          dVar180 = dVar180 * dVar180;
          dVar146 = dVar146 * dVar52 * 0.005120910384068279 +
                    dVar146 * dVar221 * -0.0056808688387635755 +
                    dVar146 * dVar254 * 0.006337888690829867 +
                    dVar146 * dVar272 * -0.007115749525616698 +
                    dVar146 * dVar151 * 0.008045977011494253 +
                    dVar146 * dVar202 * -0.009171075837742505 +
                    dVar146 * dVar165 * 0.01054945054945055 +
                    dVar146 * dVar201 * -0.012263099219620958 +
                    dVar146 * dVar209 * 0.01443001443001443 +
                    dVar146 * dVar141 * -0.01722488038277512 +
                    dVar146 * dVar200 * 0.02091503267973856 +
                    dVar146 * dVar199 * -0.025925925925925925 +
                    dVar146 * dVar198 * 0.03296703296703297 +
                    dVar146 * dVar181 * -0.04329004329004329 +
                    dVar146 * dVar153 * 0.05925925925925926 +
                    dVar146 * dVar261 * -0.08571428571428572 +
                    dVar152 * dVar146 * -0.2222222222222222 +
                    dVar146 * dVar222 * 0.13333333333333333 +
                    dVar115 * dVar180 * 0.6 +
                    dVar177 * dVar180 * -0.6666666666666666 +
                    dVar83 * dVar180 * 0.6666666666666666 +
                    dVar259 * dVar180 * -0.18947368421052632 +
                    dStack_480 * dVar180 * 0.19883040935672514 +
                    local_488 * dVar180 * -0.20915032679738563 +
                    dVar196 * dVar180 * 0.22058823529411764 +
                    local_478 * dVar180 * -0.23333333333333334 +
                    dStack_440 * dVar180 * 0.24761904761904763 +
                    local_448 * dVar180 * -0.26373626373626374 +
                    dStack_4a0 * dVar180 * 0.28205128205128205 +
                    local_4a8 * dVar180 * -0.30303030303030304 +
                    dStack_4c0 * dVar180 * 0.32727272727272727 +
                    local_4c8 * dVar180 * -0.35555555555555557 +
                    dVar246 * dVar180 * 0.3888888888888889 +
                    local_4b8 * dVar180 * -0.42857142857142855 +
                    dVar24 * dVar180 * -0.5333333333333333 + dVar253 * dVar180 * 0.47619047619047616
          ;
        }
        dVar13 = 0.0;
        dVar112 = 0.0;
        if (dVar1 < __x) {
          dVar112 = dVar78 * 0.4444444444444444 * dVar100 + dVar56 * -1.3333333333333333 * dVar25;
        }
        if (dVar1 < __x) {
          dVar13 = dVar78 * dVar26 * -0.2222222222222222 + (dVar100 * -dVar56) / 3.0;
        }
        dVar13 = (dVar154 * dVar13 * dVar114 * dVar80) / -18.0 +
                 (dVar67 * dVar241 * dVar241 * dVar114 * dVar80) / 9.0 + dVar280 + dVar120 / 27.0;
        if (dVar117 < 1.92) {
          dVar13 = (double)(~uVar8 & (ulong)dVar13);
          dVar78 = dVar217 * dVar217;
          dVar12 = (((dVar169 * dVar13 + dVar169 * dVar13) * dVar273 +
                    dVar78 * dVar30 +
                    dVar29 * dVar78 * 4.0 * dVar271 +
                    dVar169 * dVar78 * -6.0 * dVar268 +
                    dVar30 * dVar13 * dVar12 + dVar169 * 8.0 * dVar78 * dVar28) * dVar12 * 0.25 +
                   dVar85 * dVar13 * 0.25 +
                   ((-dVar169 * dVar28 * dVar13 + (dVar169 + dVar169) * dVar262 * dVar78) -
                   (dVar29 + dVar29) * dVar158 * dVar78) + dVar227 * dVar217 * 0.5) *
                   -2.6666666666666665 * dVar12 +
                   dVar27 * -2.6666666666666665 * dVar13 + dVar194 * -5.333333333333333 * dVar217;
        }
        else {
          dVar13 = (double)(uVar8 & (ulong)dVar13);
          dVar187 = dVar187 * dVar187;
          dVar12 = dVar13 * dVar57 * 0.005120910384068279 +
                   dVar13 * dVar197 * -0.0056808688387635755 +
                   dVar13 * dVar129 * 0.006337888690829867 +
                   dVar128 * dVar13 * -0.007115749525616698 +
                   dVar223 * dVar13 * 0.008045977011494253 +
                   dVar13 * dVar155 * -0.009171075837742505 +
                   dVar13 * dVar168 * 0.01054945054945055 +
                   dVar13 * dVar256 * -0.012263099219620958 +
                   dVar13 * dVar183 * 0.01443001443001443 +
                   dVar13 * dVar130 * -0.01722488038277512 +
                   dVar13 * dVar255 * 0.02091503267973856 +
                   dVar13 * dVar167 * -0.025925925925925925 +
                   dVar13 * dVar166 * 0.03296703296703297 +
                   dVar13 * dVar247 * -0.04329004329004329 +
                   dVar13 * dVar203 * 0.05925925925925926 +
                   dVar13 * dVar156 * -0.08571428571428572 +
                   dVar274 * dVar13 * -0.2222222222222222 + dVar13 * dVar142 * 0.13333333333333333 +
                   local_3b8 * dVar187 * -0.42857142857142855 +
                   dVar178 * dVar187 * 0.47619047619047616 +
                   dVar31 * dVar187 * -0.5333333333333333 +
                   dVar118 * dVar187 * 0.6 +
                   dVar208 * dVar187 * -0.6666666666666666 +
                   dVar86 * dVar187 * 0.6666666666666666 +
                   dVar260 * dVar187 * -0.18947368421052632 +
                   dStack_410 * dVar187 * 0.19883040935672514 +
                   local_418 * dVar187 * -0.20915032679738563 +
                   dVar231 * dVar187 * 0.22058823529411764 +
                   local_408 * dVar187 * -0.23333333333333334 +
                   dStack_3d0 * dVar187 * 0.24761904761904763 +
                   local_3d8 * dVar187 * -0.26373626373626374 +
                   dStack_5f0 * dVar187 * 0.28205128205128205 +
                   local_5f8 * dVar187 * -0.30303030303030304 +
                   dStack_430 * dVar187 * 0.32727272727272727 +
                   dVar162 * dVar187 * 0.3888888888888889 +
                   local_438 * dVar187 * -0.35555555555555557;
        }
        dVar13 = (dVar81 + dVar112) * 1.9236610509315362;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar3 = (long)(p->dim).v2rho2 * sVar4;
          pdVar2[lVar3 + 2] =
               ((dVar40 + ((dVar36 * (dVar10 + dVar132 + dVar63 + ((dVar9 + dVar32 + ((dVar248 +
                                                                                      dVar173 * 
                                                  -0.0003662289461201309 +
                                                  ((dVar219 - dVar37) - dVar66)) - dVar104)) -
                                                  dVar35) +
                                     dVar64 + ((dVar79 + (((dVar144 * dVar189 * -8.0 +
                                                           dVar134 * dVar189 * -8.0 +
                                                           dVar186 + dVar186 +
                                                           dVar46 * -1.1696447245269292 +
                                                           dVar121 * dVar13 * dVar92 +
                                                           dVar96 * dVar13) - dVar89) - dVar95)) -
                                              dVar14)) * 3.4602 +
                           ((dVar179 +
                            ((((((dVar263 +
                                 ((dVar33 * dVar81 * 1.5874010519681996 * dVar11 * -0.09375 -
                                  dVar88 * 0.0625) - dVar213 * dVar226 * dVar11 * 0.1875)) -
                                dVar91 * 0.0625) - dVar15 * dVar146 * dVar16 * dVar11 * 0.09375) -
                              dVar119 * dVar112 * 1.5874010519681996 * dVar11 * 0.09375) -
                             dVar18 * 0.0625) - dVar191 * dVar218 * dVar11 * 0.1875)) -
                           dVar113 * 0.0625) + dVar116 * dVar16 * dVar12 * dVar11 * -0.09375) -
                          dVar62 * 6.9204)) - dVar41) * dVar77 +
               ((dVar135 * 6.9204 +
                dVar110 * -0.1875 +
                ((dVar228 * -0.1875 + dVar192 * -0.1875 + dVar214 * -0.1875 + -dVar48) - dVar55)) -
               dVar257) + pdVar2[lVar3 + 2];
        }
      }
      sVar4 = sVar4 + 1;
    } while (np != sVar4);
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}